

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O2

void Gia_ManSwapPos(Gia_Man_t *p,int i)

{
  int iLit0;
  int iLit0_00;
  Gia_Obj_t *pGVar1;
  
  if ((-1 < i) && (i < p->vCos->nSize - p->nRegs)) {
    if (i != 0) {
      pGVar1 = Gia_ManPo(p,0);
      iLit0 = Gia_ObjFaninLit0p(p,pGVar1);
      pGVar1 = Gia_ManPo(p,i);
      iLit0_00 = Gia_ObjFaninLit0p(p,pGVar1);
      Gia_ManPatchCoDriver(p,0,iLit0_00);
      Gia_ManPatchCoDriver(p,i,iLit0);
      return;
    }
    return;
  }
  __assert_fail("i >= 0 && i < Gia_ManPoNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaUtil.c"
                ,0x65a,"void Gia_ManSwapPos(Gia_Man_t *, int)");
}

Assistant:

void Gia_ManSwapPos( Gia_Man_t * p, int i )
{
    int Lit0, LitI;
    assert( i >= 0 && i < Gia_ManPoNum(p) );
    if ( i == 0 )
        return;
    Lit0 = Gia_ObjFaninLit0p( p, Gia_ManPo(p, 0) );
    LitI = Gia_ObjFaninLit0p( p, Gia_ManPo(p, i) );
    Gia_ManPatchCoDriver( p, 0, LitI );
    Gia_ManPatchCoDriver( p, i, Lit0 );
}